

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O0

void __thiscall MeCab::anon_unknown_0::TaggerImpl::initRequestType(TaggerImpl *this)

{
  Lattice *pLVar1;
  TaggerImpl *in_RDI;
  
  pLVar1 = mutable_lattice(in_RDI);
  (*pLVar1->_vptr_Lattice[0x13])(pLVar1,(ulong)(uint)in_RDI->request_type_);
  pLVar1 = mutable_lattice(in_RDI);
  (*pLVar1->_vptr_Lattice[0xe])
            (CONCAT44((int)((ulong)in_RDI->theta_ >> 0x20),(float)in_RDI->theta_));
  return;
}

Assistant:

void initRequestType() {
    mutable_lattice()->set_request_type(request_type_);
    mutable_lattice()->set_theta(theta_);
  }